

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::processMlmNetworkNotification(MlmWrap *this,char *sender,TrodesMsg *msg)

{
  bool bVar1;
  int iVar2;
  HFSubConsumer *pHVar3;
  HFSubWorker *pHVar4;
  string *this_00;
  binarydata regdata;
  string noteType;
  HighFreqDataType registeredType;
  HFSubSockSettings sockInfo;
  string local_438 [32];
  string local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  string local_3b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  HighFreqDataType local_1d8;
  HighFreqDataType local_148;
  HighFreqDataType local_b8;
  
  TrodesMsg::popstr_abi_cxx11_(&noteType,msg);
  bVar1 = std::operator==(&noteType,"hfdt_reg");
  if (bVar1) {
    HighFreqDataType::HighFreqDataType(&registeredType);
    binarydata::binarydata(&regdata);
    std::__cxx11::string::string((string *)&local_1f8,"n",(allocator *)&sockInfo);
    TrodesMsg::popcontents<binarydata>(msg,&local_1f8,&regdata);
    std::__cxx11::string::~string((string *)&local_1f8);
    HighFreqDataType::decode(&registeredType,&regdata);
    network_pimpl::insert_hfdt(this->state,&registeredType);
    HighFreqDataType::getName_abi_cxx11_(&local_218,&registeredType);
    HighFreqDataType::getOrigin_abi_cxx11_(&local_238,&registeredType);
    bVar1 = isHfTypeCurrentlySubbed(this,&local_218,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    if (bVar1) {
      HighFreqDataType::getName_abi_cxx11_(&local_258,&registeredType);
      HighFreqDataType::getOrigin_abi_cxx11_(&local_278,&registeredType);
      getSubbedHFSockSettings(&sockInfo,this,&local_258,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      if (sockInfo.subSockType == ST_WORKER) {
        HighFreqDataType::HighFreqDataType(&local_148,&registeredType);
        pHVar4 = createWorkerSub(this,&local_148,1,sockInfo.userFoo,sockInfo.args);
        HighFreqDataType::~HighFreqDataType(&local_148);
        (*(pHVar4->super_HighFreqSub)._vptr_HighFreqSub[2])(pHVar4);
      }
      else if (sockInfo.subSockType == ST_CONSUMER) {
        HighFreqDataType::HighFreqDataType(&local_b8,&registeredType);
        pHVar3 = createConsumerSub(this,&local_b8,10);
        HighFreqDataType::~HighFreqDataType(&local_b8);
        (*(pHVar3->super_HighFreqSub)._vptr_HighFreqSub[2])(pHVar3);
      }
      HighFreqDataType::~HighFreqDataType(&sockInfo.dataType);
    }
    std::__cxx11::string::~string((string *)&regdata);
    HighFreqDataType::~HighFreqDataType(&registeredType);
  }
  else {
    bVar1 = std::operator==(&noteType,"hfdt_dereg");
    if (bVar1) {
      HighFreqDataType::HighFreqDataType(&sockInfo.dataType);
      binarydata::binarydata((binarydata *)&registeredType);
      std::__cxx11::string::string((string *)&local_298,"n",(allocator *)&regdata);
      TrodesMsg::popcontents<binarydata>(msg,&local_298,(binarydata *)&registeredType);
      std::__cxx11::string::~string((string *)&local_298);
      HighFreqDataType::decode(&sockInfo.dataType,(binarydata *)&registeredType);
      network_pimpl::remove_hfdt(this->state,&sockInfo.dataType);
      HighFreqDataType::getName_abi_cxx11_(&local_2b8,&sockInfo.dataType);
      HighFreqDataType::getOrigin_abi_cxx11_(&local_2d8,&sockInfo.dataType);
      bVar1 = isHfTypeCurrentlySubbed(this,&local_2b8,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      iVar2 = 0;
      if (bVar1) {
        HighFreqDataType::HighFreqDataType(&local_1d8,&sockInfo.dataType);
        iVar2 = removeSubFromList(this,&local_1d8);
        HighFreqDataType::~HighFreqDataType(&local_1d8);
      }
      std::__cxx11::string::~string((string *)&registeredType);
      HighFreqDataType::~HighFreqDataType(&sockInfo.dataType);
      goto LAB_0019a8be;
    }
    bVar1 = std::operator==(&noteType,"EVP");
    if (bVar1) {
      TrodesMsg::popstr_abi_cxx11_((string *)&registeredType,msg);
      TrodesMsg::popstr_abi_cxx11_(&regdata.str,msg);
      std::__cxx11::string::string((string *)&local_2f8,(string *)&registeredType);
      std::__cxx11::string::string((string *)&local_318,(string *)&regdata);
      EventDataType::EventDataType((EventDataType *)&sockInfo,&local_2f8,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      network_pimpl::insert_event(this->state,(EventDataType *)&sockInfo);
LAB_0019a5d0:
      EventDataType::~EventDataType((EventDataType *)&sockInfo);
      std::__cxx11::string::~string((string *)&regdata);
    }
    else {
      bVar1 = std::operator==(&noteType,"EVU");
      if (bVar1) {
        TrodesMsg::popstr_abi_cxx11_((string *)&registeredType,msg);
        TrodesMsg::popstr_abi_cxx11_(&regdata.str,msg);
        std::__cxx11::string::string((string *)&local_338,(string *)&registeredType);
        std::__cxx11::string::string((string *)&local_358,(string *)&regdata);
        EventDataType::EventDataType((EventDataType *)&sockInfo,&local_338,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_338);
        network_pimpl::remove_event(this->state,(EventDataType *)&sockInfo);
        goto LAB_0019a5d0;
      }
      bVar1 = std::operator==(&noteType,"_connect");
      if (bVar1) {
        TrodesMsg::popstr_abi_cxx11_((string *)&registeredType,msg);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&registeredType,"temp");
        if (bVar1) {
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&registeredType,&this->id);
          if (bVar1) {
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&registeredType,"Broker");
            if (bVar1) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->state->clients,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &registeredType);
            }
          }
        }
        std::__cxx11::string::string((string *)&local_378,"s",(allocator *)&regdata);
        std::__cxx11::string::string((string *)&local_398,(string *)&registeredType);
        TrodesMsg::TrodesMsg<std::__cxx11::string>((TrodesMsg *)&sockInfo,&local_378,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::string(local_3b8,(string *)&noteType);
        (*this->_vptr_MlmWrap[6])(this,sender,local_3b8,&sockInfo);
        this_00 = local_3b8;
      }
      else {
        bVar1 = std::operator==(&noteType,"_disconnect");
        if (!bVar1) {
          bVar1 = std::operator==(&noteType,"_expired");
          if (!bVar1) {
            std::__cxx11::string::string(local_438,(string *)&noteType);
            iVar2 = (*this->_vptr_MlmWrap[6])(this,sender,local_438,msg);
            std::__cxx11::string::~string(local_438);
            goto LAB_0019a8be;
          }
        }
        TrodesMsg::popstr_abi_cxx11_((string *)&registeredType,msg);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&registeredType,"temp");
        if (bVar1) {
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&registeredType,&this->id);
          if (bVar1) {
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&registeredType,"Broker");
            if (bVar1) {
              bVar1 = network_pimpl::client_exists(this->state,(string *)&registeredType);
              if (bVar1) {
                network_pimpl::remove_client(this->state,(string *)&registeredType);
              }
            }
          }
        }
        std::__cxx11::string::string((string *)&local_3d8,"s",(allocator *)&regdata);
        std::__cxx11::string::string((string *)&local_3f8,(string *)&registeredType);
        TrodesMsg::TrodesMsg<std::__cxx11::string>((TrodesMsg *)&sockInfo,&local_3d8,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::string(local_418,(string *)&noteType);
        (*this->_vptr_MlmWrap[6])(this,sender,local_418,&sockInfo);
        this_00 = local_418;
      }
      std::__cxx11::string::~string(this_00);
      TrodesMsg::~TrodesMsg((TrodesMsg *)&sockInfo);
    }
    std::__cxx11::string::~string((string *)&registeredType);
  }
  iVar2 = 0;
LAB_0019a8be:
  std::__cxx11::string::~string((string *)&noteType);
  return iVar2;
}

Assistant:

int MlmWrap::processMlmNetworkNotification(const char *sender, TrodesMsg &msg) {
    int rc = 0;
    std::string noteType = msg.popstr();
    if (noteType == hfdt_register) { //High Frequency Data Type was registered by *sender
        HighFreqDataType registeredType;
        binarydata regdata;
        msg.popcontents("n", regdata);
        registeredType.decode(regdata);
        state->insert_hfdt(registeredType);

        if (isHfTypeCurrentlySubbed(registeredType.getName(), registeredType.getOrigin())) {
            //resub if the module had previously been subbed to this type and the user didn't unsub manually
            HFSubSockSettings sockInfo = getSubbedHFSockSettings(registeredType.getName(), registeredType.getOrigin());

            if (sockInfo.subSockType == HighFreqSub::ST_CONSUMER) {
                HFSubConsumer *sub = createConsumerSub(registeredType, 10);
                sub->initialize();
            }
            else if (sockInfo.subSockType == HighFreqSub::ST_WORKER) {
                HFSubWorker *sub = createWorkerSub(registeredType, 1, sockInfo.userFoo, sockInfo.args);
                sub->initialize();
            }
            //todo: add some way to save the buffer size information
        }
    }
    else if (noteType == hfdt_deregister) { //High Frequency Data Type was deregistered by *sender
        HighFreqDataType deregisteredType;
        binarydata regdata;
        msg.popcontents("n", regdata);
        deregisteredType.decode(regdata);
        state->remove_hfdt(deregisteredType);

        if (isHfTypeCurrentlySubbed(deregisteredType.getName(), deregisteredType.getOrigin())) {
            rc = removeSubFromList(deregisteredType);
        }
    }
    else if(noteType == eventprovide){
        std::string event = msg.popstr();
        std::string origin = msg.popstr();
        EventDataType ev(event, origin);
        state->insert_event(ev);
    }
    else if(noteType == eventunprovide){
        std::string name = msg.popstr();
        std::string origin = msg.popstr();
        EventDataType ev(name, origin);
        state->remove_event(ev);
    }
    else if(noteType == CLIENT_CONNECT_MSG){
        std::string who = msg.popstr();
        if(who != TEMP_NETWORK_ID && who != id && who != BROKER_NETWORK_ID){
            state->insert_client(who);
        }
        TrodesMsg m("s", who);
        processNotification(sender, noteType, m);
    }
    else if(noteType == CLIENT_DISCONNECT_MSG || noteType == CLIENT_EXPIRED_MSG){
        std::string who = msg.popstr();
        if(who != TEMP_NETWORK_ID && who != id && who != BROKER_NETWORK_ID && state->client_exists(who)){
            state->remove_client(who);
        }
       TrodesMsg m("s", who);
       processNotification(sender, noteType, m);
    }
    else {
        rc = processNotification(sender, noteType, msg);
    }
    return(rc);
}